

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O3

void __thiscall icu_63::RBBITableBuilder::removeColumn(RBBITableBuilder *this,int32_t column)

{
  int iVar1;
  void *pvVar2;
  int index;
  
  iVar1 = this->fDStates->count;
  if (0 < iVar1) {
    index = 0;
    do {
      pvVar2 = UVector::elementAt(this->fDStates,index);
      UVector32::removeElementAt(*(UVector32 **)((long)pvVar2 + 0x28),column);
      index = index + 1;
    } while (iVar1 != index);
  }
  return;
}

Assistant:

void RBBITableBuilder::removeColumn(int32_t column) {
    int32_t numStates = fDStates->size();
    for (int32_t state=0; state<numStates; state++) {
        RBBIStateDescriptor *sd = (RBBIStateDescriptor *)fDStates->elementAt(state);
        U_ASSERT(column < sd->fDtran->size());
        sd->fDtran->removeElementAt(column);
    }
}